

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_keys_values.cpp
# Opt level: O1

ScalarFunction * duckdb::MapKeysFun::GetFunction(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  ScalarFunction *in_RDI;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  LogicalType local_160;
  undefined1 local_15f;
  undefined8 local_158;
  undefined8 uStack_150;
  code *local_148;
  undefined8 uStack_140;
  code *local_138;
  code *pcStack_130;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_128;
  LogicalType local_110 [24];
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  LogicalType local_e0 [24];
  BaseScalarFunction local_c8 [176];
  
  local_128.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duckdb::LogicalType::LogicalType(local_110,LIST);
  uStack_140 = 0;
  local_148 = MapKeysFunction;
  pcStack_130 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_138 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_e0,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_e0);
  if (local_138 != (code *)0x0) {
    (*local_138)(&local_148,&local_148,3);
  }
  duckdb::LogicalType::~LogicalType(local_110);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_128);
  in_RDI->field_0xa9 = 1;
  BaseScalarFunction::SetReturnsError(local_c8,&in_RDI->super_BaseScalarFunction);
  duckdb::BaseScalarFunction::~BaseScalarFunction(local_c8);
  duckdb::LogicalType::LogicalType(&local_160,ANY);
  uVar3 = uStack_150;
  uVar2 = local_158;
  in_RDI->field_0x78 = local_160;
  in_RDI->field_0x79 = local_15f;
  uVar4 = *(undefined4 *)&in_RDI->field_0x80;
  uVar6 = *(undefined4 *)&in_RDI->field_0x88;
  *(undefined8 *)&in_RDI->field_0x80 = 0;
  *(undefined8 *)&in_RDI->field_0x88 = 0;
  local_158 = 0;
  uStack_150 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&in_RDI->field_0x88;
  *(undefined8 *)&in_RDI->field_0x80 = uVar2;
  *(undefined8 *)&in_RDI->field_0x88 = uVar3;
  uVar5 = *(undefined4 *)&in_RDI->field_0x84;
  uVar7 = *(undefined4 *)&in_RDI->field_0x8c;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_f8 = uVar4;
    uStack_f4 = *(undefined4 *)&in_RDI->field_0x84;
    uStack_f0 = uVar6;
    uStack_ec = *(undefined4 *)&in_RDI->field_0x8c;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    uVar4 = local_f8;
    uVar5 = uStack_f4;
    uVar6 = uStack_f0;
    uVar7 = uStack_ec;
  }
  p_Var1 = uStack_150;
  local_158 = CONCAT44(uVar5,uVar4);
  uStack_150 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uVar7,uVar6);
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  duckdb::LogicalType::~LogicalType(&local_160);
  return in_RDI;
}

Assistant:

ScalarFunction MapKeysFun::GetFunction() {
	//! the arguments and return types are actually set in the binder function
	ScalarFunction function({}, LogicalTypeId::LIST, MapKeysFunction, MapKeysBind);
	function.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	BaseScalarFunction::SetReturnsError(function);
	function.varargs = LogicalType::ANY;
	return function;
}